

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsProtocol.hpp
# Opt level: O3

void __thiscall xs::InfoMessage::~InfoMessage(InfoMessage *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Message)._vptr_Message = (_func_int **)&PTR__InfoMessage_0010dc90;
  pcVar2 = (this->info)._M_dataplus._M_p;
  paVar1 = &(this->info).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

~InfoMessage		(void) {}